

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gulcalc.cpp
# Opt level: O2

void __thiscall
gulcalc::writemode1output
          (gulcalc *this,int event_id,OASIS_FLOAT tiv,
          vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
          *gilv,bool correlated)

{
  int iVar1;
  mapped_type *this_00;
  _Base_ptr p_Var2;
  code *pcVar3;
  pointer __k;
  pointer pvVar4;
  _Self __tmp;
  ulong uVar5;
  _Base_ptr p_Var6;
  gulSampleslevelRec gg;
  map<int,_std::vector<gulSampleslevelRec,_std::allocator<gulSampleslevelRec>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<gulSampleslevelRec,_std::allocator<gulSampleslevelRec>_>_>_>_>
  gxi;
  
  iVar1 = this->alloc_rule_;
  if (iVar1 == 2) {
    setmaxloss(this,gilv);
    iVar1 = this->alloc_rule_;
  }
  gxi._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &gxi._M_t._M_impl.super__Rb_tree_header._M_header;
  gxi._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  gxi._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  gxi._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pcVar3 = split_tiv_classic;
  if (iVar1 == 3) {
    pcVar3 = split_tiv_multiplicative;
  }
  pvVar4 = (gilv->
           super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar5 = 0;
  gxi._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       gxi._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while( true ) {
    if ((ulong)(((long)(gilv->
                       super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar4) / 0x18) <= uVar5)
    break;
    if ((uVar5 != (long)this->num_idx_ - 2U) || (uVar5 != (long)this->num_idx_ - 4U)) {
      (*pcVar3)(tiv,pvVar4 + uVar5);
      pvVar4 = (gilv->
               super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
    }
    for (__k = pvVar4[uVar5].super__Vector_base<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>.
               _M_impl.super__Vector_impl_data._M_start;
        __k != *(pointer *)
                ((long)&pvVar4[uVar5].
                        super__Vector_base<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>._M_impl.
                        super__Vector_impl_data + 8); __k = __k + 1) {
      gg.sidx = (int)uVar5 - this->num_idx_;
      gg.loss = (OASIS_FLOAT)__k->loss;
      this_00 = std::
                map<int,_std::vector<gulSampleslevelRec,_std::allocator<gulSampleslevelRec>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<gulSampleslevelRec,_std::allocator<gulSampleslevelRec>_>_>_>_>
                ::operator[](&gxi,&__k->item_id);
      std::vector<gulSampleslevelRec,_std::allocator<gulSampleslevelRec>_>::push_back(this_00,&gg);
      pvVar4 = (gilv->
               super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
    }
    uVar5 = uVar5 + 1;
  }
  for (p_Var2 = gxi._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &gxi._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    gg.loss = (OASIS_FLOAT)p_Var2[1]._M_color;
    gg.sidx = event_id;
    for (p_Var6 = p_Var2[1]._M_parent; p_Var6 != p_Var2[1]._M_left;
        p_Var6 = (_Base_ptr)&p_Var6->_M_parent) {
      if (correlated) {
        correlatedoutputgul(this,(gulitemSampleslevel *)&gg);
      }
      else {
        itemoutputgul(this,(gulitemSampleslevel *)&gg);
      }
    }
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_std::vector<gulSampleslevelRec,_std::allocator<gulSampleslevelRec>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<gulSampleslevelRec,_std::allocator<gulSampleslevelRec>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<gulSampleslevelRec,_std::allocator<gulSampleslevelRec>_>_>_>_>
  ::~_Rb_tree(&gxi._M_t);
  return;
}

Assistant:

void gulcalc::writemode1output(const int event_id, const OASIS_FLOAT tiv,
			       std::vector<std::vector<gulItemIDLoss>> &gilv,
			       const bool correlated=false) {

	// Set losses for alloc rule where
	// total peril loss = maximum subperil loss
	if (alloc_rule_ == 2) setmaxloss(gilv);

	std::map<int, std::vector<gulSampleslevelRec>> gxi;

    // select tiv split method depending on alloc_rule_
    void (*split_tiv)(std::vector<gulItemIDLoss> &, OASIS_FLOAT);
    if (alloc_rule_==3) split_tiv = &split_tiv_multiplicative;
    else split_tiv = &split_tiv_classic;
	// Check whether the sum of losses per sample exceed TIV
	// If so, split TIV in proportion to losses
	for (size_t i = 0; i < gilv.size(); i++) {

		if ((i != num_idx_ + std_dev_idx) ||
		    (i != num_idx_ + number_of_affected_risk_idx)) {
			split_tiv(gilv[i], tiv);
		}

		auto iter = gilv[i].begin();
		while (iter != gilv[i].end()) {

			gulSampleslevelRec gg;
			gg.sidx = i - num_idx_;
			gg.loss = iter->loss;

			gxi[iter->item_id].push_back(gg);
			iter++;

		}

	}

	// Output all items associated with current coverage ID
	// Output the rows here
	auto iter = gxi.begin();
	while (iter != gxi.end()) {
		gulitemSampleslevel g;
		g.event_id = event_id;
		g.item_id = iter->first;
		auto iter2 = iter->second.begin();
		while (iter2 != iter->second.end()) {
			g.sidx = iter2->sidx;
			g.loss = iter2->loss;
			if (correlated) correlatedoutputgul(g);
			else itemoutputgul(g);
			iter2++;
		}
		iter++;
	}

}